

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O0

wchar_t prt_health_aux(wchar_t row,wchar_t col)

{
  monster *mon_00;
  byte bVar1;
  _Bool _Var2;
  int iVar3;
  wchar_t local_30;
  wchar_t local_2c;
  wchar_t len;
  wchar_t pct;
  monster *mon;
  uint8_t attr;
  wchar_t col_local;
  wchar_t row_local;
  
  bVar1 = monster_health_attr();
  mon_00 = player->upkeep->health_who;
  if (mon_00 == (monster *)0x0) {
    Term_erase(col,row,L'\f');
    col_local = L'\0';
  }
  else {
    _Var2 = monster_is_visible(mon_00);
    if (((_Var2) && (player->timed[6] == 0)) && (-1 < mon_00->hp)) {
      iVar3 = (int)(((long)mon_00->hp * 100) / (long)mon_00->maxhp);
      if (iVar3 < 10) {
        local_2c = L'\x01';
      }
      else {
        if (iVar3 < 0x5a) {
          local_30 = iVar3 / 10 + L'\x01';
        }
        else {
          local_30 = L'\n';
        }
        local_2c = local_30;
      }
      Term_putstr(col,row,L'\f',L'\x01',"[----------]");
      Term_putstr(col + L'\x01',row,local_2c,(uint)bVar1,"**********");
    }
    else {
      Term_putstr(col,row,L'\f',(uint)bVar1,"[----------]");
    }
    col_local = L'\f';
  }
  return col_local;
}

Assistant:

static int prt_health_aux(int row, int col)
{
	uint8_t attr = monster_health_attr();
	struct monster *mon = player->upkeep->health_who;

	/* Not tracking */
	if (!mon) {
		/* Erase the health bar */
		Term_erase(col, row, 12);
		return 0;
	}

	/* Tracking an unseen, hallucinatory, or dead monster */
	if (!monster_is_visible(mon) || /* Unseen */
		(player->timed[TMD_IMAGE]) || /* Hallucination */
		(mon->hp < 0)) { /* Dead (?) */
		/* The monster health is "unknown" */
		Term_putstr(col, row, 12, attr, "[----------]");
	} else { /* Visible */
		/* Extract the "percent" of health */
		int pct = 100L * mon->hp / mon->maxhp;

		/* Convert percent into "health" */
		int len = (pct < 10) ? 1 : (pct < 90) ? (pct / 10 + 1) : 10;

		/* Default to "unknown" */
		Term_putstr(col, row, 12, COLOUR_WHITE, "[----------]");

		/* Dump the current "health" (use '*' symbols) */
		Term_putstr(col + 1, row, len, attr, "**********");
	}

	return 12;
}